

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O2

Rational *
soplex::LPFreadValue(Rational *__return_storage_ptr__,char **pos,SPxOut *spxout,int lineno)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  SPxOut *pSVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  byte bVar10;
  bool bVar11;
  char *pcVar12;
  byte *pbVar13;
  Verbosity old_verbosity;
  undefined4 uStack_2074;
  char tmp [8192];
  
  pcVar12 = *pos;
  _old_verbosity = 1;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor<long_long>
            (&__return_storage_ptr__->m_backend,(longlong *)&old_verbosity,(type *)0x0);
  if ((*pcVar12 == '-') || (*pcVar12 == '+')) {
    pcVar12 = pcVar12 + 1;
  }
  pbVar13 = (byte *)(pcVar12 + -1);
  bVar3 = false;
  do {
    bVar11 = bVar3;
    bVar1 = pbVar13[1];
    pbVar13 = pbVar13 + 1;
    bVar3 = true;
  } while ((byte)(bVar1 - 0x30) < 10);
  bVar9 = bVar1;
  bVar3 = bVar11;
  if (bVar1 == 0x2e) {
    do {
      bVar11 = bVar3;
      bVar9 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
      bVar3 = true;
    } while ((byte)(bVar9 - 0x30) < 10);
  }
  iVar5 = tolower((int)(char)bVar9);
  if (iVar5 == 0x65) {
    if ((pbVar13[1] == 0x2d) || (pbVar13[1] == 0x2b)) {
      pbVar13 = pbVar13 + 2;
    }
    else {
      pbVar13 = pbVar13 + 1;
    }
    pbVar13 = pbVar13 + -1;
    bVar4 = 1;
    do {
      bVar10 = bVar4;
      bVar9 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
      bVar4 = 0;
    } while ((byte)(bVar9 - 0x30) < 10);
  }
  else {
    bVar10 = 0;
  }
  if (bVar9 == 0x2f) {
    bVar3 = true;
    do {
      bVar2 = bVar3;
      bVar9 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
      bVar3 = false;
    } while ((byte)(bVar9 - 0x30) < 10);
    if (((bVar1 == 0x2e) || (iVar5 == 0x65 || bVar2)) ||
       ((bVar9 < 0x2f && ((0x680000000000U >> ((ulong)bVar9 & 0x3f) & 1) != 0)))) {
      if (spxout == (SPxOut *)0x0) goto LAB_0012aa8d;
    }
    else {
      iVar5 = tolower((int)(char)bVar9);
      if ((spxout == (SPxOut *)0x0) || (iVar5 != 0x65)) goto LAB_0012aa16;
    }
    if (0 < (int)spxout->m_verbosity) {
      old_verbosity = spxout->m_verbosity;
      (*spxout->_vptr_SPxOut[2])(spxout);
      pSVar6 = operator<<(spxout,"WLPFRD03 Warning: In line ");
      pSVar6 = operator<<(pSVar6,lineno);
      operator<<(pSVar6,": malformed rational value in LP file\n");
      (*spxout->_vptr_SPxOut[2])(spxout,&old_verbosity);
    }
  }
LAB_0012aa16:
  if (((bool)(bVar10 & spxout != (SPxOut *)0x0)) && (0 < (int)spxout->m_verbosity)) {
    old_verbosity = spxout->m_verbosity;
    (*spxout->_vptr_SPxOut[2])(spxout);
    pSVar6 = operator<<(spxout,"WLPFRD01 Warning: In line ");
    pSVar6 = operator<<(pSVar6,lineno);
    operator<<(pSVar6,
               ": found empty exponent in LP file - check for forbidden variable names with initial \'e\' or \'E\'\n"
              );
    (*spxout->_vptr_SPxOut[2])(spxout,&old_verbosity);
  }
LAB_0012aa8d:
  pbVar7 = (byte *)*pos;
  if (bVar11) {
    pbVar8 = (byte *)tmp;
    while (pbVar7 != pbVar13) {
      *pbVar8 = *pbVar7;
      pbVar8 = pbVar8 + 1;
      pbVar7 = pbVar7 + 1;
      *pos = (char *)pbVar7;
    }
    *pbVar8 = 0;
    ratFromString((Rational *)&old_verbosity,tmp);
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)__return_storage_ptr__,
                (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)&old_verbosity);
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~rational((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                 *)&old_verbosity);
  }
  else {
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                 *)__return_storage_ptr__,(ulong)(*pbVar7 != 0x2d) * 2 + -1);
  }
  *pos = (char *)pbVar13;
  if (((ulong)*pbVar13 < 0x21) && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0)) {
    *pos = (char *)(pbVar13 + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static Rational LPFreadValue(char*& pos, SPxOut* spxout, const int lineno = -1)
{
   assert(LPFisValue(pos));

   char        tmp[SOPLEX_LPF_MAX_LINE_LEN];
   const char* s = pos;
   char*       t;
   Rational        value = 1;
   bool        has_digits = false;
   bool        has_emptyexponent = false;
   bool        has_dot = false;
   bool        has_exponent = false;
   bool        has_emptydivisor = false;

   // 1. sign
   if((*s == '+') || (*s == '-'))
      s++;

   // 2. Digits before the decimal dot
   while((*s >= '0') && (*s <= '9'))
   {
      has_digits = true;
      s++;
   }

   // 3. Decimal dot
   if(*s == '.')
   {
      has_dot = true;
      s++;

      // 4. If there was a dot, possible digit behind it
      while((*s >= '0') && (*s <= '9'))
      {
         has_digits = true;
         s++;
      }
   }

   // 5. Exponent
   if(tolower(*s) == 'e')
   {
      has_exponent = true;
      has_emptyexponent = true;
      s++;

      // 6. Exponent sign
      if((*s == '+') || (*s == '-'))
         s++;

      // 7. Exponent digits
      while((*s >= '0') && (*s <= '9'))
      {
         has_emptyexponent = false;
         s++;
      }
   }

   // 8. Division
   if(*s == '/')
   {
      s++;
      has_emptydivisor = true;

      while((*s >= '0') && (*s <= '9'))
      {
         has_emptydivisor = false;
         s++;
      }

      if(has_dot || has_exponent || has_emptydivisor ||
            (*s == '.') || (*s == '+') || (*s == '-') || (tolower(*s) == 'e'))
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD03 Warning: In line " << lineno <<
                         ": malformed rational value in LP file\n";)
      }
   }


   assert(s != pos);

   if(has_emptyexponent)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD01 Warning: In line " << lineno <<
                      ": found empty exponent in LP file - check for forbidden variable names with initial 'e' or 'E'\n");
   }

   if(!has_digits)
      value = (*pos == '-') ? -1 : 1;
   else
   {
      for(t = tmp; pos != s; pos++)
         *t++ = *pos;

      *t = '\0';

      try
      {
         value = ratFromString(tmp);
      }
      catch(const std::exception& e)
      {
         SPX_MSG_WARNING((*spxout), (*spxout) << "WLPFRD04 Warning: In line " << lineno <<
                         ": malformed rational value in LP file\n");
         std::cerr << e.what() << '\n';
      }
   }

   pos += s - pos;

   assert(pos == s);

   SPxOut::debug(spxout, "DLPFRD01 LPFreadValue = {}\n", value);

   if(LPFisSpace(*pos))
      pos++;

   return value;
}